

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O0

void u_setMemoryFunctions_63
               (void *context,UMemAllocFn *a,UMemReallocFn *r,UMemFreeFn *f,UErrorCode *status)

{
  UMemAllocFn *pUVar1;
  void *pvVar2;
  UMemFreeFn *pUVar3;
  UMemReallocFn *pUVar4;
  UBool UVar5;
  UErrorCode *status_local;
  UMemFreeFn *f_local;
  UMemReallocFn *r_local;
  UMemAllocFn *a_local;
  void *context_local;
  
  UVar5 = U_FAILURE(*status);
  pUVar1 = pAlloc;
  pvVar2 = pContext;
  pUVar3 = pFree;
  pUVar4 = pRealloc;
  if ((UVar5 == '\0') &&
     (((a == (UMemAllocFn *)0x0 || (r == (UMemReallocFn *)0x0)) ||
      (pUVar1 = a, pvVar2 = context, pUVar3 = f, pUVar4 = r, f == (UMemFreeFn *)0x0)))) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    pUVar1 = pAlloc;
    pvVar2 = pContext;
    pUVar3 = pFree;
    pUVar4 = pRealloc;
  }
  pRealloc = pUVar4;
  pFree = pUVar3;
  pContext = pvVar2;
  pAlloc = pUVar1;
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_setMemoryFunctions(const void *context, UMemAllocFn *a, UMemReallocFn *r, UMemFreeFn *f,  UErrorCode *status)
{
    if (U_FAILURE(*status)) {
        return;
    }
    if (a==NULL || r==NULL || f==NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    pContext  = context;
    pAlloc    = a;
    pRealloc  = r;
    pFree     = f;
}